

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processFinished(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llbuild::basic::ProcessResult_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,ProcessResult *result)

{
  if (*(long *)((long)this + 8) != 0) {
    anon_unknown.dwarf_214010::get_command_result(result->status);
    (*(code *)(*(undefined8 **)((long)this + 8))[4])(**(undefined8 **)((long)this + 8));
  }
  return;
}

Assistant:

virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }